

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.h
# Opt level: O2

void __thiscall
Js::SerializationCloner<Js::StreamWriter>::
WriteArrayIndexProperties<Js::SerializationCloner<Js::StreamWriter>::JavascriptArrayDirectItemAccessor>
          (SerializationCloner<Js::StreamWriter> *this,JavascriptArray *arr)

{
  Type TVar1;
  ScriptContext *pSVar2;
  int iVar3;
  Engine *this_00;
  uint32 i;
  uint uVar4;
  void *local_38;
  Var value;
  
  pSVar2 = (this->
           super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
           ).super_ScriptContextHolder.m_scriptContext;
  TVar1 = (arr->super_ArrayObject).length;
  for (uVar4 = 0; TVar1 != uVar4; uVar4 = uVar4 + 1) {
    local_38 = (void *)0x0;
    iVar3 = (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x26])(arr,arr,(ulong)uVar4,&local_38,pSVar2);
    if (iVar3 == 1) {
      this_00 = ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                ::GetEngine(&this->
                             super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                           );
      SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_>::Clone
                (this_00,local_38);
    }
    else {
      Write(this,0);
    }
  }
  return;
}

Assistant:

void WriteArrayIndexProperties(JavascriptArray* arr)
        {
            ScriptContext* scriptContext = this->GetScriptContext();
            uint32 length = arr->GetLength();

            for (uint32 i = 0; i < length; i++)
            {
                Var value = nullptr;
                if (ArrayItemAccessor::GetItem(arr, i, &value, scriptContext))
                {
                    this->GetEngine()->Clone(value);
                }
                else
                {
                    WriteTypeId(SCA_None);
                }
            }
        }